

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void getOptions(int *argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 *__ptr;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  builtin_strncpy(commandLine,"Command: ",10);
  sVar3 = strlen(commandLine);
  for (lVar6 = 0; lVar6 < *argc; lVar6 = lVar6 + 1) {
    pcVar1 = argv[lVar6];
    sVar4 = strlen(pcVar1);
    if (999 < sVar4 + ((long)((sVar3 << 0x20) + 0x100000000) >> 0x20)) break;
    strcat(commandLine,pcVar1);
    sVar4 = strlen(commandLine);
    (commandLine + sVar4)[0] = ' ';
    (commandLine + sVar4)[1] = '\0';
    sVar4 = strlen(argv[lVar6]);
    sVar3 = ((long)(sVar3 << 0x20) >> 0x20) + 1 + sVar4;
  }
  initOptions();
  uVar7 = (ulong)*argc;
  __ptr = (undefined8 *)malloc(uVar7 << 3);
  *__ptr = *argv;
  uVar8 = 1;
  iVar10 = 1;
  do {
    iVar2 = (int)uVar8;
    if ((int)uVar7 <= iVar10) {
      uVar5 = 0;
      uVar7 = 0;
      if (0 < iVar2) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        argv[uVar5] = (char *)__ptr[uVar5];
      }
      *argc = iVar2;
      free(__ptr);
      if ((booleanOptions[3] == 0) && (booleanOptions[5] == 0)) {
        return;
      }
      printHelp();
      exit(1);
    }
    pcVar1 = argv[iVar10];
    if (*pcVar1 == '-') {
      iVar2 = checkBooleanOption(pcVar1);
      iVar9 = iVar10 + 1;
      if (iVar2 == 0) {
        iVar2 = *argc;
        if (iVar9 < iVar2) {
          iVar2 = checkStringOption(argv[iVar10],argv[iVar9]);
          if (iVar2 == 0) {
            iVar2 = *argc;
            goto LAB_00101a18;
          }
        }
        else {
LAB_00101a18:
          if ((iVar2 <= iVar9) || (iVar2 = checkIntOption(argv[iVar10],argv[iVar9]), iVar2 == 0)) {
            fprintf(_stderr,"Unrecognised option %s\n",argv[iVar10]);
            goto LAB_00101a43;
          }
        }
        iVar9 = iVar10 + 2;
      }
    }
    else {
      iVar9 = iVar10 + 1;
      uVar8 = (ulong)(iVar2 + 1);
      __ptr[iVar2] = pcVar1;
    }
LAB_00101a43:
    uVar7 = (ulong)(uint)*argc;
    iVar10 = iVar9;
  } while( true );
}

Assistant:

void getOptions (int *argc, char * argv[])
{
    char **newArgv;
    int oldp, newp, p, pos;

    strcpy (commandLine, "Command: ");
    pos=strlen(commandLine);
    for (p=0; p<*argc && pos+1+strlen(argv[p])<1000;p++)
    {
        strcat (commandLine, argv[p]);
        strcat (commandLine, " ");
        pos += 1 + strlen (argv[p]);
    }


    initOptions();

    newArgv = (char **) malloc ( (*argc)*sizeof(char *));

    oldp = 0;
    newp = 0;

    newArgv[newp++] = argv[oldp++];

    while (oldp < *argc)
    {
        if (strlen (argv[oldp]) == 0 || argv[oldp][0] != '-')
            newArgv[newp++] = argv[oldp++];
        else
        {
            if (checkBooleanOption (argv[oldp]))
                oldp++;
            else
                if (oldp+1 < *argc && checkStringOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
                if (oldp+1 < *argc && checkIntOption (argv[oldp],argv[oldp+1]))
                    oldp += 2;
            else
            {
                fprintf (stderr, "Unrecognised option %s\n", argv[oldp]);
                oldp++;
            }
        }

    }

    for (p=0;p<newp;p++)
        argv[p] = newArgv[p];
    *argc = newp;

    free (newArgv);

    if (booleanOptions[HELP] || booleanOptions[HELP_SHORT])
    {
        printHelp();
        exit(1);
    }


}